

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O0

ResultValue * __thiscall
FloatType::toResultValue
          (ResultValue *__return_storage_ptr__,FloatType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  char cVar1;
  NumericChars *pNVar2;
  size_type sVar3;
  const_reference pvVar4;
  double value_00;
  bool local_5a;
  bool exit;
  ulong uStack_58;
  value_type c;
  size_t i;
  allocator local_39;
  undefined1 local_38 [8];
  string value;
  NumericConstant *numericConstant_local;
  FloatType *this_local;
  
  value.field_2._8_8_ = numericConstant;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uStack_58 = 0;
  while( true ) {
    pNVar2 = NumericConstant::chars((NumericConstant *)value.field_2._8_8_);
    sVar3 = std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::size(pNVar2);
    if (sVar3 <= uStack_58) break;
    pNVar2 = NumericConstant::chars((NumericConstant *)value.field_2._8_8_);
    pvVar4 = std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::operator[]
                       (pNVar2,uStack_58);
    numChar = *pvVar4;
    local_5a = false;
    if (numChar < A) {
LAB_001aa13a:
      cVar1 = NumericConstantChars::getChar(numChar);
      std::__cxx11::string::operator+=((string *)local_38,cVar1);
    }
    else if ((byte)(numChar - MinusSign) < 2) {
      if (uStack_58 == 0) {
        cVar1 = NumericConstantChars::getChar(numChar);
        std::__cxx11::string::operator+=((string *)local_38,cVar1);
      }
      local_5a = uStack_58 != 0;
    }
    else {
      if (numChar == DecimalPoint) goto LAB_001aa13a;
      if (numChar == ImaginaryUnit) {
        local_5a = true;
      }
    }
    if (local_5a) break;
    uStack_58 = uStack_58 + 1;
  }
  value_00 = std::__cxx11::stod((string *)local_38,(size_t *)0x0);
  ResultValue::ResultValue(__return_storage_ptr__,value_00);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ResultValue FloatType::toResultValue(const NumericConstant& numericConstant) const {
	std::string value = "";

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];
		bool exit = false;

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				value += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					exit = true;
				} else {
					value += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				exit = true;
				break;
			default:
				break;
		}

		if (exit) {
			break;
		}
	}

	return std::stod(value);
}